

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CollisionPdu.cpp
# Opt level: O2

void __thiscall DIS::CollisionPdu::unmarshal(CollisionPdu *this,DataStream *dataStream)

{
  EntityInformationFamilyPdu::unmarshal(&this->super_EntityInformationFamilyPdu,dataStream);
  EntityID::unmarshal(&this->_issuingEntityID,dataStream);
  EntityID::unmarshal(&this->_collidingEntityID,dataStream);
  EventID::unmarshal(&this->_eventID,dataStream);
  DataStream::operator>>(dataStream,&this->_collisionType);
  DataStream::operator>>(dataStream,&this->_pad);
  Vector3Float::unmarshal(&this->_velocity,dataStream);
  DataStream::operator>>(dataStream,&this->_mass);
  Vector3Float::unmarshal(&this->_location,dataStream);
  return;
}

Assistant:

void CollisionPdu::unmarshal(DataStream& dataStream)
{
    EntityInformationFamilyPdu::unmarshal(dataStream); // unmarshal information in superclass first
    _issuingEntityID.unmarshal(dataStream);
    _collidingEntityID.unmarshal(dataStream);
    _eventID.unmarshal(dataStream);
    dataStream >> _collisionType;
    dataStream >> _pad;
    _velocity.unmarshal(dataStream);
    dataStream >> _mass;
    _location.unmarshal(dataStream);
}